

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choker.cpp
# Opt level: O0

bool libtorrent::anon_unknown_8::bittyrant_unchoke_compare
               (peer_connection *lhs,peer_connection *rhs)

{
  int iVar1;
  long lVar2;
  long *plVar3;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_60;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_58;
  long local_50 [2];
  int64_t local_40;
  int64_t u2;
  int64_t u1;
  int64_t d2;
  int64_t d1;
  peer_connection *rhs_local;
  peer_connection *lhs_local;
  
  d1 = (int64_t)rhs;
  rhs_local = lhs;
  d2 = peer_connection::downloaded_in_last_round(lhs);
  u1 = peer_connection::downloaded_in_last_round((peer_connection *)d1);
  u2 = peer_connection::uploaded_in_last_round(rhs_local);
  local_40 = peer_connection::uploaded_in_last_round((peer_connection *)d1);
  iVar1 = peer_connection::get_priority(rhs_local,0);
  d2 = iVar1 * d2;
  iVar1 = peer_connection::get_priority((peer_connection *)d1,0);
  u1 = iVar1 * u1;
  lVar2 = d2 * 1000;
  local_50[1] = 1;
  plVar3 = std::max<long>(local_50 + 1,&u2);
  d2 = lVar2 / *plVar3;
  lVar2 = u1 * 1000;
  local_50[0] = 1;
  plVar3 = std::max<long>(local_50,&local_40);
  u1 = lVar2 / *plVar3;
  if (d2 == u1) {
    local_58.__d.__r = (duration)peer_connection::time_of_last_unchoke(rhs_local);
    local_60.__d.__r = (duration)peer_connection::time_of_last_unchoke((peer_connection *)d1);
    lhs_local._7_1_ = std::chrono::operator<(&local_58,&local_60);
  }
  else {
    lhs_local._7_1_ = u1 < d2;
  }
  return lhs_local._7_1_;
}

Assistant:

bool bittyrant_unchoke_compare(peer_connection const* lhs
		, peer_connection const* rhs)
	{
		// first compare how many bytes they've sent us
		std::int64_t d1 = lhs->downloaded_in_last_round();
		std::int64_t d2 = rhs->downloaded_in_last_round();
		// divided by the number of bytes we've sent them
		std::int64_t const u1 = lhs->uploaded_in_last_round();
		std::int64_t const u2 = rhs->uploaded_in_last_round();

		// take torrent priority into account
		d1 *= lhs->get_priority(peer_connection::upload_channel);
		d2 *= rhs->get_priority(peer_connection::upload_channel);

		d1 = d1 * 1000 / std::max(std::int64_t(1), u1);
		d2 = d2 * 1000 / std::max(std::int64_t(1), u2);
		if (d1 != d2) return d1 > d2;

		// if both peers are still in their send quota or not in their send quota
		// prioritize the one that has waited the longest to be unchoked
		return lhs->time_of_last_unchoke() < rhs->time_of_last_unchoke();
	}